

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool,true,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  bool bVar3;
  ulong idx;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar7;
  uhugeint_t right;
  uhugeint_t right_00;
  uhugeint_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    puVar4 = &rdata->upper;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      right_01.upper = *puVar4;
      right_01.lower = ((uhugeint_t *)(puVar4 + -1))->lower;
      bVar3 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThan,duckdb::uhugeint_t,duckdb::uhugeint_t,bool>
                        (fun,*ldata,right_01,mask,idx_00);
      result_data[idx_00] = bVar3;
      puVar4 = puVar4 + 2;
    }
  }
  else {
    idx_01 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar7 = count;
        }
LAB_0030c1d2:
        puVar4 = &rdata[idx_01].upper;
        for (; idx = idx_01, idx_01 < uVar7; idx_01 = idx_01 + 1) {
          right.upper = *puVar4;
          right.lower = ((uhugeint_t *)(puVar4 + -1))->lower;
          bVar3 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::GreaterThan,duckdb::uhugeint_t,duckdb::uhugeint_t,bool>
                            (fun,*ldata,right,mask,idx_01);
          result_data[idx_01] = bVar3;
          puVar4 = puVar4 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar7 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar7 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0030c1d2;
        idx = uVar7;
        if (uVar2 != 0) {
          puVar4 = &rdata[idx_01].upper;
          for (uVar6 = 0; idx = idx_01 + uVar6, idx < uVar7; uVar6 = uVar6 + 1) {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              right_00.upper = *puVar4;
              right_00.lower = ((uhugeint_t *)(puVar4 + -1))->lower;
              bVar3 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::GreaterThan,duckdb::uhugeint_t,duckdb::uhugeint_t,bool>
                                (fun,*ldata,right_00,mask,idx);
              result_data[uVar6 + idx_01] = bVar3;
            }
            puVar4 = puVar4 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}